

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

size_t bpkiPrivkeyDec(octet *privkey,size_t *privkey_len,octet *pki,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  octet *poVar3;
  octet *poVar4;
  size_t sVar5;
  size_t sStack_90;
  der_anchor_t BignAlgId [1];
  der_anchor_t PKI [1];
  
  sVar1 = derTSEQDecStart(PKI,pki,count,0x30);
  poVar4 = (octet *)0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    poVar3 = pki + sVar1;
    sVar2 = derTSIZEDec2(poVar3,count - sVar1,2,0);
    if (sVar2 != 0xffffffffffffffff) {
      sVar5 = (count - sVar1) - sVar2;
      poVar3 = poVar3 + sVar2;
      sVar1 = derTSEQDecStart(BignAlgId,poVar3,sVar5,0x30);
      if (sVar1 != 0xffffffffffffffff) {
        sVar5 = sVar5 - sVar1;
        sVar2 = derOIDDec2(poVar3 + sVar1,sVar5,"1.2.112.0.2.0.34.101.45.2.1");
        if (sVar2 != 0xffffffffffffffff) {
          poVar3 = poVar3 + sVar1 + sVar2;
          sVar5 = sVar5 - sVar2;
          sVar1 = derOIDDec2(poVar3,sVar5,"1.2.112.0.2.0.34.101.45.3.0");
          if (sVar1 == 0xffffffffffffffff) {
            sVar1 = derOIDDec2(poVar3,sVar5,"1.2.112.0.2.0.34.101.45.3.1");
            if (sVar1 == 0xffffffffffffffff) {
              sVar1 = derOIDDec2(poVar3,sVar5,"1.2.112.0.2.0.34.101.45.3.2");
              if (sVar1 == 0xffffffffffffffff) {
                sVar1 = derOIDDec2(poVar3,sVar5,"1.2.112.0.2.0.34.101.45.3.3");
                if (sVar1 == 0xffffffffffffffff) {
                  return 0xffffffffffffffff;
                }
                sStack_90 = 0x40;
              }
              else {
                sStack_90 = 0x30;
              }
            }
            else {
              sStack_90 = 0x20;
            }
          }
          else {
            sStack_90 = 0x18;
          }
          poVar3 = poVar3 + sVar1;
          sVar2 = derTSEQDecStop(poVar3,BignAlgId);
          if (sVar2 != 0xffffffffffffffff) {
            poVar3 = poVar3 + sVar2;
            sVar1 = derTOCTDec2(privkey,poVar3,sVar5 - (sVar1 + sVar2),4,sStack_90);
            if (sVar1 != 0xffffffffffffffff) {
              sVar2 = derTSEQDecStop(poVar3 + sVar1,PKI);
              if (sVar2 != 0xffffffffffffffff) {
                if (privkey_len != (size_t *)0x0) {
                  *privkey_len = sStack_90;
                }
                poVar4 = poVar3 + sVar1 + (sVar2 - (long)pki);
              }
            }
          }
        }
      }
    }
  }
  return (size_t)poVar4;
}

Assistant:

static size_t bpkiPrivkeyDec(octet privkey[], size_t* privkey_len,
	const octet pki[], size_t count)
{
	der_anchor_t PKI[1];
	der_anchor_t BignAlgId[1];
	const octet* ptr = pki;
	size_t t, len;
	// декодировать
	derDecStep(derSEQDecStart(PKI, ptr, count), ptr, count);
	 derDecStep(derSIZEDec2(ptr, count, 0), ptr, count);
	 derDecStep(derSEQDecStart(BignAlgId, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_pubkey), ptr, count);
	  if ((t = derOIDDec2(ptr, count, oid_bign_curve192v1)) != SIZE_MAX)
		  len = 24;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve256v1)) != SIZE_MAX)
		  len = 32;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve384v1)) != SIZE_MAX)
		  len = 48;
	  else if ((t = derOIDDec2(ptr, count, oid_bign_curve512v1)) != SIZE_MAX)
		  len = 64;
	  else
		  return SIZE_MAX;
	  ptr += t, count -= t;
	 derDecStep(derSEQDecStop(ptr, BignAlgId), ptr, count);
	 derDecStep(derOCTDec2(privkey, ptr, count, len), ptr, count);
	derDecStep(derSEQDecStop(ptr, PKI), ptr, count);
	// возвратить длину ключа
	if (privkey_len)
	{
		ASSERT(memIsValid(privkey_len, O_PER_S));
		*privkey_len = len;
	}
	// возвратить точную длину DER-кода
	return ptr - pki;
}